

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_atomic.h
# Opt level: O0

bool density::raw_atomic_compare_exchange_strong
               (uintptr_t *i_atomic,uintptr_t *i_expected,uintptr_t i_desired,memory_order i_success
               ,memory_order i_failure)

{
  uintptr_t uVar1;
  int iVar2;
  int iVar3;
  uintptr_t uVar4;
  bool local_31;
  memory_order i_failure_local;
  memory_order i_success_local;
  uintptr_t i_desired_local;
  uintptr_t *i_expected_local;
  uintptr_t *i_atomic_local;
  
  iVar2 = detail::mem_order_cnv(i_success);
  iVar3 = detail::mem_order_cnv(i_failure);
  switch(iVar2) {
  case 1:
  case 2:
    if (iVar3 - 1U < 2) {
      uVar1 = *i_expected;
      LOCK();
      uVar4 = *i_atomic;
      local_31 = uVar1 == uVar4;
      if (local_31) {
        *i_atomic = i_desired;
        uVar4 = uVar1;
      }
      UNLOCK();
      if (!local_31) {
        *i_expected = uVar4;
      }
    }
    else if (iVar3 == 5) {
      uVar1 = *i_expected;
      LOCK();
      uVar4 = *i_atomic;
      local_31 = uVar1 == uVar4;
      if (local_31) {
        *i_atomic = i_desired;
        uVar4 = uVar1;
      }
      UNLOCK();
      if (!local_31) {
        *i_expected = uVar4;
      }
    }
    else {
      uVar1 = *i_expected;
      LOCK();
      uVar4 = *i_atomic;
      local_31 = uVar1 == uVar4;
      if (local_31) {
        *i_atomic = i_desired;
        uVar4 = uVar1;
      }
      UNLOCK();
      if (!local_31) {
        *i_expected = uVar4;
      }
    }
    break;
  case 3:
    if (iVar3 - 1U < 2) {
      uVar1 = *i_expected;
      LOCK();
      uVar4 = *i_atomic;
      local_31 = uVar1 == uVar4;
      if (local_31) {
        *i_atomic = i_desired;
        uVar4 = uVar1;
      }
      UNLOCK();
      if (!local_31) {
        *i_expected = uVar4;
      }
    }
    else if (iVar3 == 5) {
      uVar1 = *i_expected;
      LOCK();
      uVar4 = *i_atomic;
      local_31 = uVar1 == uVar4;
      if (local_31) {
        *i_atomic = i_desired;
        uVar4 = uVar1;
      }
      UNLOCK();
      if (!local_31) {
        *i_expected = uVar4;
      }
    }
    else {
      uVar1 = *i_expected;
      LOCK();
      uVar4 = *i_atomic;
      local_31 = uVar1 == uVar4;
      if (local_31) {
        *i_atomic = i_desired;
        uVar4 = uVar1;
      }
      UNLOCK();
      if (!local_31) {
        *i_expected = uVar4;
      }
    }
    break;
  case 4:
    if (iVar3 - 1U < 2) {
      uVar1 = *i_expected;
      LOCK();
      uVar4 = *i_atomic;
      local_31 = uVar1 == uVar4;
      if (local_31) {
        *i_atomic = i_desired;
        uVar4 = uVar1;
      }
      UNLOCK();
      if (!local_31) {
        *i_expected = uVar4;
      }
    }
    else if (iVar3 == 5) {
      uVar1 = *i_expected;
      LOCK();
      uVar4 = *i_atomic;
      local_31 = uVar1 == uVar4;
      if (local_31) {
        *i_atomic = i_desired;
        uVar4 = uVar1;
      }
      UNLOCK();
      if (!local_31) {
        *i_expected = uVar4;
      }
    }
    else {
      uVar1 = *i_expected;
      LOCK();
      uVar4 = *i_atomic;
      local_31 = uVar1 == uVar4;
      if (local_31) {
        *i_atomic = i_desired;
        uVar4 = uVar1;
      }
      UNLOCK();
      if (!local_31) {
        *i_expected = uVar4;
      }
    }
    break;
  case 5:
    if (iVar3 - 1U < 2) {
      uVar1 = *i_expected;
      LOCK();
      uVar4 = *i_atomic;
      local_31 = uVar1 == uVar4;
      if (local_31) {
        *i_atomic = i_desired;
        uVar4 = uVar1;
      }
      UNLOCK();
      if (!local_31) {
        *i_expected = uVar4;
      }
    }
    else if (iVar3 == 5) {
      uVar1 = *i_expected;
      LOCK();
      uVar4 = *i_atomic;
      local_31 = uVar1 == uVar4;
      if (local_31) {
        *i_atomic = i_desired;
        uVar4 = uVar1;
      }
      UNLOCK();
      if (!local_31) {
        *i_expected = uVar4;
      }
    }
    else {
      uVar1 = *i_expected;
      LOCK();
      uVar4 = *i_atomic;
      local_31 = uVar1 == uVar4;
      if (local_31) {
        *i_atomic = i_desired;
        uVar4 = uVar1;
      }
      UNLOCK();
      if (!local_31) {
        *i_expected = uVar4;
      }
    }
    break;
  default:
    if (iVar3 - 1U < 2) {
      uVar1 = *i_expected;
      LOCK();
      uVar4 = *i_atomic;
      local_31 = uVar1 == uVar4;
      if (local_31) {
        *i_atomic = i_desired;
        uVar4 = uVar1;
      }
      UNLOCK();
      if (!local_31) {
        *i_expected = uVar4;
      }
    }
    else if (iVar3 == 5) {
      uVar1 = *i_expected;
      LOCK();
      uVar4 = *i_atomic;
      local_31 = uVar1 == uVar4;
      if (local_31) {
        *i_atomic = i_desired;
        uVar4 = uVar1;
      }
      UNLOCK();
      if (!local_31) {
        *i_expected = uVar4;
      }
    }
    else {
      uVar1 = *i_expected;
      LOCK();
      uVar4 = *i_atomic;
      local_31 = uVar1 == uVar4;
      if (local_31) {
        *i_atomic = i_desired;
        uVar4 = uVar1;
      }
      UNLOCK();
      if (!local_31) {
        *i_expected = uVar4;
      }
    }
  }
  return local_31;
}

Assistant:

inline bool raw_atomic_compare_exchange_strong(
      uintptr_t *       i_atomic,
      uintptr_t *       i_expected,
      uintptr_t         i_desired,
      std::memory_order i_success,
      std::memory_order i_failure) noexcept
    {
        DENSITY_ASSUME_ALIGNED((void *)i_atomic, alignof(decltype(i_atomic)));

        return __atomic_compare_exchange_n(
          i_atomic,
          i_expected,
          i_desired,
          false,
          detail::mem_order_cnv(i_success),
          detail::mem_order_cnv(i_failure));
    }